

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Ed25519.c
# Opt level: O3

void Hacl_Impl_Ed25519_Sign_Steps_point_mul_g_compress(uint8_t *out,uint8_t *s)

{
  uint64_t tmp [20];
  uint64_t auStack_158 [20];
  uint64_t local_b8 [20];
  
  memset(auStack_158,0,0xa0);
  local_b8[0] = 0x62d608f25d51a;
  local_b8[1] = 0x412a4b4f6592a;
  local_b8[2] = 0x75b7171a4b31d;
  local_b8[3] = 0x1ff60527118fe;
  local_b8[4] = 0x216936d3cd6e5;
  local_b8[5] = 0x6666666666658;
  local_b8[6] = 0x4cccccccccccc;
  local_b8[7] = 0x1999999999999;
  local_b8[8] = 0x3333333333333;
  local_b8[9] = 0x6666666666666;
  local_b8[10] = 1;
  local_b8[0xb] = 0;
  local_b8[0xc] = 0;
  local_b8[0xd] = 0;
  local_b8[0xe] = 0;
  local_b8[0xf] = 0x68ab3a5b7dda3;
  local_b8[0x10] = 0xeea2a5eadbb;
  local_b8[0x11] = 0x2af8df483c27e;
  local_b8[0x12] = 0x332b375274732;
  local_b8[0x13] = 0x67875f0fd78b7;
  Hacl_Impl_Ed25519_Ladder_point_mul(auStack_158,s,local_b8);
  Hacl_Impl_Ed25519_PointCompress_point_compress(out,auStack_158);
  return;
}

Assistant:

static void Hacl_Impl_Ed25519_Sign_Steps_point_mul_g_compress(uint8_t *out, uint8_t *s)
{
  uint64_t tmp[20U] = { 0U };
  Hacl_Impl_Ed25519_Sign_Steps_point_mul_g(tmp, s);
  Hacl_Impl_Ed25519_PointCompress_point_compress(out, tmp);
}